

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O0

void __thiscall soul::Compiler::addDefaultBuiltInLibrary(Compiler *this)

{
  string_view moduleName;
  string_view moduleName_00;
  string_view moduleName_01;
  string_view moduleName_02;
  string_view moduleName_03;
  string_view moduleName_04;
  string_view moduleName_05;
  string_view moduleName_06;
  string_view moduleName_07;
  undefined1 auStack_1b0 [7];
  AbortCompilationException anon_var_0;
  CodeLocation local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  CodeLocation local_180;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  CodeLocation local_160;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  CodeLocation local_140;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  CodeLocation local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  CodeLocation local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  CodeLocation local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  CodeLocation local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  CodeLocation local_a0;
  CodeLocation local_90 [2];
  undefined1 local_70 [8];
  CompileMessageHandler handler;
  CompileMessageList list;
  Compiler *this_local;
  
  CompileMessageList::CompileMessageList((CompileMessageList *)&handler.lastHandler);
  CompileMessageHandler::CompileMessageHandler
            ((CompileMessageHandler *)local_70,(CompileMessageList *)&handler.lastHandler);
  getDefaultLibraryCode();
  compile(this,local_90);
  CodeLocation::~CodeLocation(local_90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"soul.audio.utils");
  moduleName._M_str = (char *)local_b0._M_len;
  moduleName._M_len = (size_t)&local_a0;
  getSystemModule(moduleName);
  compile(this,&local_a0);
  CodeLocation::~CodeLocation(&local_a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"soul.midi");
  moduleName_00._M_str = (char *)local_d0._M_len;
  moduleName_00._M_len = (size_t)&local_c0;
  getSystemModule(moduleName_00);
  compile(this,&local_c0);
  CodeLocation::~CodeLocation(&local_c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"soul.notes");
  moduleName_01._M_str = (char *)local_f0._M_len;
  moduleName_01._M_len = (size_t)&local_e0;
  getSystemModule(moduleName_01);
  compile(this,&local_e0);
  CodeLocation::~CodeLocation(&local_e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,"soul.frequency");
  moduleName_02._M_str = (char *)local_110._M_len;
  moduleName_02._M_len = (size_t)&local_100;
  getSystemModule(moduleName_02);
  compile(this,&local_100);
  CodeLocation::~CodeLocation(&local_100);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"soul.mixing")
  ;
  moduleName_03._M_str = (char *)local_130._M_len;
  moduleName_03._M_len = (size_t)&local_120;
  getSystemModule(moduleName_03);
  compile(this,&local_120);
  CodeLocation::~CodeLocation(&local_120);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_150,"soul.oscillators");
  moduleName_04._M_str = (char *)local_150._M_len;
  moduleName_04._M_len = (size_t)&local_140;
  getSystemModule(moduleName_04);
  compile(this,&local_140);
  CodeLocation::~CodeLocation(&local_140);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"soul.noise");
  moduleName_05._M_str = (char *)local_170._M_len;
  moduleName_05._M_len = (size_t)&local_160;
  getSystemModule(moduleName_05);
  compile(this,&local_160);
  CodeLocation::~CodeLocation(&local_160);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,"soul.timeline");
  moduleName_06._M_str = (char *)local_190._M_len;
  moduleName_06._M_len = (size_t)&local_180;
  getSystemModule(moduleName_06);
  compile(this,&local_180);
  CodeLocation::~CodeLocation(&local_180);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_1b0,"soul.filters");
  moduleName_07._M_str = _auStack_1b0;
  moduleName_07._M_len = (size_t)&local_1a0;
  getSystemModule(moduleName_07);
  compile(this,&local_1a0);
  CodeLocation::~CodeLocation(&local_1a0);
  CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)local_70);
  CompileMessageList::~CompileMessageList((CompileMessageList *)&handler.lastHandler);
  return;
}

Assistant:

void Compiler::addDefaultBuiltInLibrary()
{
    CompileMessageList list;

    try
    {
        soul::CompileMessageHandler handler (list);
        compile (getDefaultLibraryCode());

        // TODO: when we have import & module support, these will no longer be hard-coded here
        compile (getSystemModule ("soul.audio.utils"));
        compile (getSystemModule ("soul.midi"));
        compile (getSystemModule ("soul.notes"));
        compile (getSystemModule ("soul.frequency"));
        compile (getSystemModule ("soul.mixing"));
        compile (getSystemModule ("soul.oscillators"));
        compile (getSystemModule ("soul.noise"));
        compile (getSystemModule ("soul.timeline"));
        compile (getSystemModule ("soul.filters"));
    }
    catch (soul::AbortCompilationException)
    {
        soul::throwInternalCompilerError ("Error in built-in code: " + list.toString());
    }
}